

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

void __thiscall google::protobuf::compiler::python::Generator::PrintServices(Generator *this)

{
  ServiceDescriptor *pSVar1;
  int i;
  int index;
  string_view text;
  
  for (index = 0; index < this->file_->service_count_; index = index + 1) {
    pSVar1 = FileDescriptor::service(this->file_,index);
    PrintServiceClass(this,pSVar1);
    pSVar1 = FileDescriptor::service(this->file_,index);
    PrintServiceStub(this,pSVar1);
    text._M_str = "\n";
    text._M_len = 1;
    io::Printer::Print<>(this->printer_,text);
  }
  return;
}

Assistant:

void Generator::PrintServices() const {
  for (int i = 0; i < file_->service_count(); ++i) {
    PrintServiceClass(*file_->service(i));
    PrintServiceStub(*file_->service(i));
    printer_->Print("\n");
  }
}